

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<tinyusdz::value::half,3ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          array<tinyusdz::value::half,_3UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_5c;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_54;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv_1;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_40;
  optional<std::array<tinyusdz::value::half,_3UL>_> pv;
  array<tinyusdz::value::half,_3UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<tinyusdz::value::half,_3UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00574e84;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv);
  if (bVar1) {
    get_default_value<std::array<tinyusdz::value::half,3ul>>
              ((optional<std::array<tinyusdz::value::half,_3UL>_> *)((long)&pv_1.contained + 2),this
              );
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
    optional<std::array<tinyusdz::value::half,_3UL>,_0>
              (&local_40,
               (optional<std::array<tinyusdz::value::half,_3UL>_> *)((long)&pv_1.contained + 2));
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional
              ((optional<std::array<tinyusdz::value::half,_3UL>_> *)((long)&pv_1.contained + 2));
    pv_1.has_value_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
    if (pv_1.has_value_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                         (&local_40);
      *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar2->_M_elems;
      v->_M_elems[2].value = pvVar2->_M_elems[2].value;
      this_local._7_1_ = 1;
    }
    pv_1._1_3_ = 0;
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_40);
    if (pv_1._0_4_ != 0) goto LAB_00574e84;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00574e84;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<tinyusdz::value::half,_3UL>,_nullptr>
                   (&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<tinyusdz::value::half,3ul>>(&local_5c,this);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>(&local_54,&local_5c);
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_5c)
      ;
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_54);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                           (&local_54);
        *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar2->_M_elems;
        v->_M_elems[2].value = pvVar2->_M_elems[2].value;
        this_local._7_1_ = 1;
      }
      pv_1._1_3_ = 0;
      pv_1.has_value_ = bVar1;
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_54)
      ;
      if (pv_1._0_4_ != 0) goto LAB_00574e84;
    }
    this_local._7_1_ = 0;
  }
LAB_00574e84:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }